

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O2

int64_t FILE_skip(archive *a,void *client_data,int64_t request)

{
  int iVar1;
  int64_t iVar2;
  off_t skip;
  read_FILE_data *mine;
  
  iVar2 = 0;
  if (((request != 0) && (*(char *)((long)client_data + 0x18) != '\0')) &&
     (iVar1 = fseeko(*client_data,request,1), iVar2 = request, iVar1 != 0)) {
    *(undefined1 *)((long)client_data + 0x18) = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int64_t
FILE_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;
#if HAVE__FSEEKI64
	int64_t skip = request;
#elif HAVE_FSEEKO
	off_t skip = (off_t)request;
#else
	long skip = (long)request;
#endif
	int skip_bits = sizeof(skip) * 8 - 1;

	(void)a; /* UNUSED */

	/*
	 * If we can't skip, return 0 as the amount we did step and
	 * the caller will work around by reading and discarding.
	 */
	if (!mine->can_skip)
		return (0);
	if (request == 0)
		return (0);

	/* If request is too big for a long or an off_t, reduce it. */
	if (sizeof(request) > sizeof(skip)) {
		int64_t max_skip =
		    (((int64_t)1 << (skip_bits - 1)) - 1) * 2 + 1;
		if (request > max_skip)
			skip = max_skip;
	}

#ifdef __ANDROID__
        /* fileno() isn't safe on all platforms ... see above. */
	if (lseek(fileno(mine->f), skip, SEEK_CUR) < 0)
#elif HAVE__FSEEKI64
	if (_fseeki64(mine->f, skip, SEEK_CUR) != 0)
#elif HAVE_FSEEKO
	if (fseeko(mine->f, skip, SEEK_CUR) != 0)
#else
	if (fseek(mine->f, skip, SEEK_CUR) != 0)
#endif
	{
		mine->can_skip = 0;
		return (0);
	}
	return (request);
}